

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O0

int __thiscall
OpenMD::FluctuatingChargeConstraints::getNumberOfFlucQConstraints
          (FluctuatingChargeConstraints *this)

{
  bool bVar1;
  int iVar2;
  Molecule *this_00;
  size_type sVar3;
  long in_RDI;
  int region;
  int systemConstrain;
  Molecule *mol;
  MoleculeIterator i;
  int nConstraints;
  FluctuatingChargeConstraints *in_stack_ffffffffffffffc0;
  int local_2c;
  MoleculeIterator *in_stack_ffffffffffffffd8;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> in_stack_ffffffffffffffe0;
  int local_14;
  int local_4;
  
  local_14 = 0;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_ffffffffffffffc0);
  }
  if ((*(byte *)(in_RDI + 9) & 1) == 0) {
    local_4 = 0;
  }
  else {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator
              ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)
               &stack0xffffffffffffffe0);
    local_2c = 0;
    for (this_00 = SimInfo::beginMolecule
                             ((SimInfo *)in_stack_ffffffffffffffe0._M_node,in_stack_ffffffffffffffd8
                             ); this_00 != (Molecule *)0x0;
        this_00 = SimInfo::nextMolecule
                            ((SimInfo *)in_stack_ffffffffffffffe0._M_node,
                             (MoleculeIterator *)this_00)) {
      bVar1 = Molecule::constrainTotalCharge(this_00);
      if (bVar1) {
        local_14 = local_14 + 1;
      }
      else {
        iVar2 = Molecule::getRegion((Molecule *)0x2188cb);
        if (((*(byte *)(in_RDI + 10) & 1) == 0) || (iVar2 < 0)) {
          local_2c = 1;
        }
      }
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40));
    local_4 = local_14 + (int)sVar3 + local_2c;
  }
  return local_4;
}

Assistant:

int FluctuatingChargeConstraints::getNumberOfFlucQConstraints() {
    int nConstraints = 0;
    if (!initialized_) initialize();
    if (!hasFlucQ_) return 0;
    SimInfo::MoleculeIterator i;
    Molecule* mol;
    int systemConstrain = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (mol->constrainTotalCharge()) {
        nConstraints++;
      } else {
        int region = mol->getRegion();
        if (!constrainRegions_ || region < 0) { systemConstrain = 1; }
      }
    }
    return nConstraints + regionCMom_.size() + systemConstrain;
  }